

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  undefined1 auVar1 [16];
  CuePoint *pCVar2;
  bool bVar3;
  longlong lVar4;
  longlong lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long len;
  long local_68;
  TrackPosition *local_60;
  CuePoint *local_58;
  long local_50;
  TrackPosition *local_48;
  long local_40;
  longlong local_38;
  
  lVar6 = this->m_timecode;
  if (-1 < lVar6) {
    return true;
  }
  local_58 = this;
  lVar4 = ReadID(pReader,-lVar6,&local_68);
  if (lVar4 == 0xbb) {
    lVar11 = local_68 - lVar6;
    lVar4 = ReadUInt(pReader,lVar11,&local_68);
    lVar11 = lVar11 + local_68;
    lVar9 = lVar4 + lVar11;
    local_38 = lVar6 + lVar9;
    local_60 = (TrackPosition *)0x0;
    bVar7 = false;
    local_50 = lVar11;
    local_40 = -lVar6;
    while (pCVar2 = local_58, lVar11 < lVar9) {
      lVar4 = ReadID(pReader,lVar11,&local_68);
      if (lVar4 < 0) {
        bVar3 = false;
        bVar7 = false;
      }
      else {
        lVar10 = local_68 + lVar11;
        lVar6 = lVar11;
        if ((((lVar9 < lVar10) ||
             (lVar5 = ReadUInt(pReader,lVar10,&local_68), lVar6 = lVar10, lVar5 < 0)) ||
            (lVar11 = local_68 + lVar10, lVar9 < lVar11)) ||
           (lVar10 = lVar11 + lVar5, lVar6 = lVar11, lVar9 < lVar10)) {
          bVar3 = false;
          bVar7 = false;
          lVar11 = lVar6;
        }
        else if (lVar4 == 0xb7) {
          local_60 = (TrackPosition *)((long)local_60 + 1);
          if ((ulong)local_60 >> 0x20 == 0) goto LAB_0015d0b7;
          bVar7 = true;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (lVar4 == 0xb3) {
            lVar4 = UnserializeUInt(pReader,lVar11,lVar5);
            local_58->m_timecode = lVar4;
            lVar11 = lVar10;
          }
          else {
LAB_0015d0b7:
            bVar3 = true;
            lVar11 = lVar10;
          }
        }
      }
      if (!bVar3) {
        return bVar7;
      }
    }
    local_58->m_track_positions_count = (size_t)local_60;
    if (local_60 != (TrackPosition *)0x0 && -1 < local_58->m_timecode) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_60;
      uVar8 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
        uVar8 = SUB168(auVar1 * ZEXT816(0x18),0);
      }
      local_60 = (TrackPosition *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
      pCVar2->m_track_positions = local_60;
      if (local_60 != (TrackPosition *)0x0) {
        do {
          lVar6 = local_50;
          if (lVar9 <= local_50) {
            local_58->m_element_start = local_40;
            local_58->m_element_size = local_38;
            return true;
          }
          lVar4 = ReadID(pReader,local_50,&local_68);
          if ((lVar4 < 0) || (lVar6 = local_68 + lVar6, lVar9 < lVar6)) {
            bVar3 = false;
            bVar7 = false;
          }
          else {
            lVar5 = ReadUInt(pReader,lVar6,&local_68);
            lVar6 = lVar6 + local_68;
            if (lVar4 == 0xb7) {
              local_48 = local_60 + 1;
              bVar3 = TrackPosition::Parse(local_60,pReader,lVar6,lVar5);
              bVar7 = (bool)(bVar7 & bVar3);
              if (!bVar3) {
                bVar3 = false;
                local_60 = local_48;
                local_50 = lVar6;
                goto LAB_0015d1d7;
              }
              local_60 = local_48;
            }
            bVar3 = lVar6 + lVar5 <= lVar9;
            bVar7 = (bool)(bVar7 & bVar3);
            local_50 = lVar6 + lVar5;
          }
LAB_0015d1d7:
          if (!bVar3) {
            return bVar7;
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}